

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapLoadBuiltin(jx9_vm *pVm)

{
  int iVar1;
  jx9_value *pValue;
  undefined8 *puVar2;
  ulong local_50;
  char *local_40;
  jx9_value *pSuper;
  sxu32 n;
  sxi32 rc;
  SyString *pFile;
  jx9_vm *pVm_local;
  
  pSuper._0_4_ = 0;
  while( true ) {
    if (8 < (uint)pSuper) {
      puVar2 = (undefined8 *)SySetPeek(&pVm->aFiles);
      if (puVar2 == (undefined8 *)0x0) {
        local_40 = ":Memory:";
        local_50 = 8;
      }
      else {
        local_40 = (char *)*puVar2;
        local_50 = (ulong)*(uint *)(puVar2 + 1);
      }
      jx9_vm_config(pVm,8,"SCRIPT_FILENAME",local_40,local_50);
      return 0;
    }
    pValue = jx9_new_array(pVm);
    if (pValue == (jx9_value *)0x0) break;
    iVar1 = jx9_vm_config(pVm,6,jx9HashmapLoadBuiltin::azSuper[(uint)pSuper],pValue);
    if (iVar1 != 0) {
      return iVar1;
    }
    jx9_release_value(pVm,pValue);
    pSuper._0_4_ = (uint)pSuper + 1;
  }
  return -1;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapLoadBuiltin(jx9_vm *pVm)
{
	static const char * azSuper[] = {
		"_SERVER",   /* $_SERVER */
		"_GET",      /* $_GET */
		"_POST",     /* $_POST */
		"_FILES",    /* $_FILES */
		"_REQUEST",  /* $_REQUEST */
		"_COOKIE",   /* $_COOKIE */
		"_ENV",      /* $_ENV */
		"_HEADER",   /* $_HEADER */
		"argv"       /* $argv */
	};
	SyString *pFile;
	sxi32 rc;
	sxu32 n;
	/* Install globals variable now */
	for( n =  0 ; n < SX_ARRAYSIZE(azSuper)  ; n++ ){
		jx9_value *pSuper;
		/* Request an empty array */
		pSuper = jx9_new_array(&(*pVm));
		if( pSuper == 0 ){
			return SXERR_MEM;
		}
		/* Install */
		rc = jx9_vm_config(&(*pVm),JX9_VM_CONFIG_CREATE_VAR, azSuper[n]/* Super-global name*/, pSuper/* Super-global value */);
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Release the value now it have been installed */
		jx9_release_value(&(*pVm), pSuper);
	}
	/* Set some $_SERVER entries */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	/*
	 * 'SCRIPT_FILENAME'
	 * The absolute pathname of the currently executing script.
	 */
	jx9_vm_config(pVm, JX9_VM_CONFIG_SERVER_ATTR, 
		"SCRIPT_FILENAME", 
		pFile ? pFile->zString : ":Memory:", 
		pFile ? pFile->nByte : sizeof(":Memory:") - 1
		);
	/* All done, all global variables are installed now */
	return SXRET_OK;
}